

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O2

EncodeNumberStatus
spvtools::utils::ParseAndEncodeNumber
          (char *text,NumberType *type,function<void_(unsigned_int)> *emit,string *error_msg)

{
  EncodeNumberStatus EVar1;
  _Any_data *p_Var2;
  ErrorMsgStream local_70;
  _Any_data local_60;
  code *local_50;
  _Any_data local_40;
  code *local_30;
  
  if (text == (char *)0x0) {
    anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_70,error_msg);
    (anonymous_namespace)::ErrorMsgStream::operator<<
              ((ErrorMsgStream *)&local_70,"The given text is a nullptr");
    anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_70);
    return kInvalidText;
  }
  if (type->kind == SPV_NUMBER_FLOATING) {
    std::function<void_(unsigned_int)>::function((function<void_(unsigned_int)> *)&local_40,emit);
    EVar1 = ParseAndEncodeFloatingPointNumber
                      (text,type,(function<void_(unsigned_int)> *)&local_40,error_msg);
    if (local_30 == (code *)0x0) {
      return EVar1;
    }
    p_Var2 = &local_40;
    local_50 = local_30;
  }
  else {
    if (type->kind == SPV_NUMBER_NONE) {
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_70,error_msg);
      (anonymous_namespace)::ErrorMsgStream::operator<<
                ((ErrorMsgStream *)&local_70,"The expected type is not a integer or float type");
      anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_70);
      return kInvalidUsage;
    }
    std::function<void_(unsigned_int)>::function((function<void_(unsigned_int)> *)&local_60,emit);
    EVar1 = ParseAndEncodeIntegerNumber
                      (text,type,(function<void_(unsigned_int)> *)&local_60,error_msg);
    if (local_50 == (code *)0x0) {
      return EVar1;
    }
    p_Var2 = &local_60;
  }
  (*local_50)(p_Var2,p_Var2,__destroy_functor);
  return EVar1;
}

Assistant:

EncodeNumberStatus ParseAndEncodeNumber(const char* text,
                                        const NumberType& type,
                                        std::function<void(uint32_t)> emit,
                                        std::string* error_msg) {
  if (!text) {
    ErrorMsgStream(error_msg) << "The given text is a nullptr";
    return EncodeNumberStatus::kInvalidText;
  }

  if (IsUnknown(type)) {
    ErrorMsgStream(error_msg)
        << "The expected type is not a integer or float type";
    return EncodeNumberStatus::kInvalidUsage;
  }

  // If we explicitly expect a floating-point number, we should handle that
  // first.
  if (IsFloating(type)) {
    return ParseAndEncodeFloatingPointNumber(text, type, emit, error_msg);
  }

  return ParseAndEncodeIntegerNumber(text, type, emit, error_msg);
}